

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getConnection<slang::ast::PortSymbol>
          (PortConnectionBuilder *this,PortSymbol *port)

{
  ulong uVar1;
  PortConnectionSyntax *this_00;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_01;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_02;
  SourceRange range;
  SourceRange range_00;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_03;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_04;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference ppPVar5;
  pointer ppVar6;
  PortConnectionBuilder *this_01;
  PortSymbol *in_RSI;
  long in_RDI;
  iterator iVar7;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar8;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attrs;
  NamedPortConnectionSyntax *conn;
  iterator it;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attrs_1;
  PortConnectionSyntax *pc;
  bool hasDefault;
  anon_class_16_2_3fb12ad6 reportUnconnected;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  PortConnectionBuilder *in_stack_fffffffffffffd80;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffd88;
  Scope *in_stack_fffffffffffffd90;
  PortSymbol *in_stack_fffffffffffffd98;
  PortConnectionBuilder *in_stack_fffffffffffffda0;
  pointer in_stack_fffffffffffffda8;
  PortSymbol *pPVar9;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdb0;
  __extent_storage<18446744073709551615UL> _Var10;
  anon_class_16_2_3fb12ad6 *in_stack_fffffffffffffe10;
  PropertyExprSyntax *in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe30 [16];
  pointer in_stack_fffffffffffffe40;
  NamedPortConnectionSyntax *pNVar11;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 isWildcard;
  PortSymbol *in_stack_fffffffffffffe70;
  PortConnectionBuilder *this_02;
  SourceLocation SVar12;
  SourceLocation SVar13;
  table_element_pointer ppVar14;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe98;
  PortConnection *local_d8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
  local_b0;
  string_view *local_98;
  PortConnectionBuilder *local_90;
  iterator local_88;
  size_t local_78;
  PortSymbol *local_70;
  PortConnectionBuilder *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  PortSymbol *local_10;
  PortConnectionBuilder *local_8;
  
  bVar2 = PortSymbol::hasInitializer(in_RSI);
  bVar3 = false;
  if (bVar2) {
    bVar3 = in_RSI->direction == In;
  }
  if ((*(byte *)(in_RDI + 0x1d0) & 1) == 0) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      (&(in_RSI->super_Symbol).name);
    if (bVar2) {
      local_d8 = getConnection<slang::ast::PortSymbol>::anon_class_16_2_3fb12ad6::operator()
                           (in_stack_fffffffffffffe10);
    }
    else {
      this_01 = (PortConnectionBuilder *)(in_RDI + 0x178);
      local_98 = &(in_RSI->super_Symbol).name;
      local_90 = this_01;
      local_70 = (PortSymbol *)local_98;
      local_68 = this_01;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                 ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                             *)in_stack_fffffffffffffd80,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      pPVar9 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)in_stack_fffffffffffffd80,
                                CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_20 = local_78;
      _Var10._M_extent_value = (size_t)this_01;
      local_10 = pPVar9;
      local_8 = this_01;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                             *)0x7a9cf6);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                     ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)0x7a9d45);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffffd90 =
                 (Scope *)boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                  *)0x7a9d95);
            in_stack_fffffffffffffd98 = local_10;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
            ::
            key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>>
                      ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>
                        *)0x7a9dc2);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               this_01,(basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_fffffffffffffd98,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffd90);
            isWildcard = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_007a9eb6;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffd80,
                           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        isWildcard = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
        if (bVar2) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
          ::table_locator(&local_b0);
          goto LAB_007a9eb6;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,(size_t)((PortConnectionBuilder *)_Var10._M_extent_value)->comp
                          );
        isWildcard = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
      } while (bVar2);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
      ::table_locator(&local_b0);
LAB_007a9eb6:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                 ::make_iterator((locator *)0x7a9ec3);
      SVar13 = (SourceLocation)local_88.pc_;
      ppVar14 = local_88.p_;
      iVar7 = boost::unordered::
              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
              ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                     *)0x7a9f2c);
      this_02 = (PortConnectionBuilder *)iVar7.pc_;
      SVar12 = (SourceLocation)iVar7.p_;
      bVar2 = boost::unordered::detail::foa::operator==
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffd80,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      if (bVar2) {
        if ((*(byte *)(in_RDI + 0x1d1) & 1) == 0) {
          if (bVar3) {
            std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::span
                      ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                       0x7aa012);
            sVar8._M_extent._M_extent_value = _Var10._M_extent_value;
            sVar8._M_ptr = (pointer)pPVar9;
            local_d8 = defaultConnection(this_01,in_stack_fffffffffffffd98,sVar8);
          }
          else {
            local_d8 = getConnection<slang::ast::PortSymbol>::anon_class_16_2_3fb12ad6::operator()
                                 (in_stack_fffffffffffffe10);
          }
        }
        else {
          attributes_03._M_extent._M_extent_value = in_stack_fffffffffffffe98._M_extent_value;
          attributes_03._M_ptr = (pointer)ppVar14;
          range.endLoc = SVar13;
          range.startLoc = SVar12;
          local_d8 = implicitNamedPort<slang::ast::PortSymbol>
                               (this_02,*(PortSymbol **)(in_RDI + 0x1b8),attributes_03,range,
                                SUB81((ulong)*(undefined8 *)(in_RDI + 0x1b0) >> 0x38,0));
        }
      }
      else {
        ppVar6 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffd80);
        pNVar11 = (ppVar6->second).first;
        ppVar6 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffd80);
        (ppVar6->second).second = true;
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        syntax_00._M_extent._M_extent_value = _Var10._M_extent_value;
        syntax_00._M_ptr = (pointer)pPVar9;
        lookupLocation_00._8_8_ = this_01;
        lookupLocation_00.scope = (Scope *)in_stack_fffffffffffffd98;
        sVar8 = AttributeSymbol::fromSyntax(syntax_00,in_stack_fffffffffffffd90,lookupLocation_00);
        bVar3 = parsing::Token::operator_cast_to_bool((Token *)0x7aa101);
        if (bVar3) {
          if (pNVar11->expr == (PropertyExprSyntax *)0x0) {
            local_d8 = emptyConnection(in_stack_fffffffffffffd80,
                                       (PortSymbol *)
                                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                                      );
          }
          else {
            attributes_02._M_extent._M_extent_value = in_stack_fffffffffffffe48._M_extent_value;
            attributes_02._M_ptr = (pointer)pNVar11;
            local_d8 = createConnection<slang::ast::PortSymbol>
                                 ((PortConnectionBuilder *)
                                  sVar8._M_extent._M_extent_value._M_extent_value,
                                  (PortSymbol *)sVar8._M_ptr,in_stack_fffffffffffffe28,attributes_02
                                 );
          }
        }
        else {
          parsing::Token::range((Token *)this_01);
          attributes_04._M_extent._M_extent_value = in_stack_fffffffffffffe98._M_extent_value;
          attributes_04._M_ptr = (pointer)ppVar14;
          range_00.endLoc = SVar13;
          range_00.startLoc = SVar12;
          local_d8 = implicitNamedPort<slang::ast::PortSymbol>
                               (this_02,in_stack_fffffffffffffe70,attributes_04,range_00,
                                (bool)isWildcard);
        }
      }
    }
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 0x218);
    sVar4 = SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>::size
                      ((SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*> *)
                       (in_RDI + 0x30));
    if (uVar1 < sVar4) {
      sVar4 = *(size_type *)(in_RDI + 0x218);
      *(size_type *)(in_RDI + 0x218) = sVar4 + 1;
      ppPVar5 = SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>::operator[]
                          ((SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*> *)
                           (in_RDI + 0x30),sVar4);
      this_00 = *ppPVar5;
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      syntax._M_extent._M_extent_value = in_stack_fffffffffffffdb0._M_extent_value;
      syntax._M_ptr = in_stack_fffffffffffffda8;
      lookupLocation._8_8_ = in_stack_fffffffffffffda0;
      lookupLocation.scope = (Scope *)in_stack_fffffffffffffd98;
      AttributeSymbol::fromSyntax(syntax,in_stack_fffffffffffffd90,lookupLocation);
      if ((this_00->super_SyntaxNode).kind == OrderedPortConnection) {
        slang::syntax::SyntaxNode::as<slang::syntax::OrderedPortConnectionSyntax>
                  (&this_00->super_SyntaxNode);
        not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                  ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x7a9afc);
        attributes_01._M_extent._M_extent_value = in_stack_fffffffffffffe48._M_extent_value;
        attributes_01._M_ptr = in_stack_fffffffffffffe40;
        local_d8 = createConnection<slang::ast::PortSymbol>
                             (in_stack_fffffffffffffe30._8_8_,in_stack_fffffffffffffe30._0_8_,
                              in_stack_fffffffffffffe28,attributes_01);
      }
      else {
        attributes_00._M_extent._M_extent_value = in_stack_fffffffffffffdb0._M_extent_value;
        attributes_00._M_ptr = (pointer)in_stack_fffffffffffffda8;
        local_d8 = defaultConnection(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                                     attributes_00);
      }
    }
    else {
      *(long *)(in_RDI + 0x218) = *(long *)(in_RDI + 0x218) + 1;
      if (bVar3) {
        std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::span
                  ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                   0x7a99e1);
        attributes._M_extent._M_extent_value = in_stack_fffffffffffffdb0._M_extent_value;
        attributes._M_ptr = (pointer)in_stack_fffffffffffffda8;
        local_d8 = defaultConnection(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,attributes)
        ;
      }
      else {
        local_d8 = getConnection<slang::ast::PortSymbol>::anon_class_16_2_3fb12ad6::operator()
                             (in_stack_fffffffffffffe10);
      }
    }
  }
  return local_d8;
}

Assistant:

PortConnection* getConnection(const TPort& port) {
        auto reportUnconnected = [&] {
            if (port.direction == ArgumentDirection::Ref) {
                if (port.name.empty()) {
                    if (!unnamedRefError) {
                        auto& diag = scope.addDiag(diag::RefPortUnnamedUnconnected,
                                                   instance.location);
                        diag.addNote(diag::NoteDeclarationHere, port.location);
                        unnamedRefError = true;
                    }
                }
                else {
                    scope.addDiag(diag::RefPortUnconnected, instance.location) << port.name;
                }
            }
            else {
                if (port.name.empty()) {
                    if (!warnedAboutUnnamed) {
                        auto& diag = scope.addDiag(diag::UnconnectedUnnamedPort, instance.location);
                        diag.addNote(diag::NoteDeclarationHere, port.location);
                        warnedAboutUnnamed = true;
                    }
                }
                else {
                    scope.addDiag(diag::UnconnectedNamedPort, instance.location) << port.name;
                }
            }
            return emptyConnection(port);
        };

        const bool hasDefault = port.hasInitializer() && port.direction == ArgumentDirection::In;
        if (connMap.usingOrdered) {
            if (orderedIndex >= connMap.orderedConns.size()) {
                orderedIndex++;

                if (hasDefault)
                    return defaultConnection(port, {});

                return reportUnconnected();
            }

            const PortConnectionSyntax& pc = *connMap.orderedConns[orderedIndex++];
            auto attrs = AttributeSymbol::fromSyntax(pc.attributes, scope, lookupLocation);
            if (pc.kind == SyntaxKind::OrderedPortConnection)
                return createConnection(port, *pc.as<OrderedPortConnectionSyntax>().expr, attrs);
            else
                return defaultConnection(port, attrs);
        }

        if (port.name.empty()) {
            // port is unnamed so can never be connected by name
            return reportUnconnected();
        }

        auto it = connMap.namedConns.find(port.name);
        if (it == connMap.namedConns.end()) {
            if (connMap.hasWildcard)
                return implicitNamedPort(port, connMap.wildcardAttrs, connMap.wildcardRange, true);

            if (hasDefault)
                return defaultConnection(port, {});

            return reportUnconnected();
        }

        // We have a named connection; there are two possibilities here:
        // - An explicit connection (with an optional expression)
        // - An implicit connection, where we have to look up the name ourselves
        const NamedPortConnectionSyntax& conn = *it->second.first;
        it->second.second = true;

        auto attrs = AttributeSymbol::fromSyntax(conn.attributes, scope, lookupLocation);
        if (conn.openParen) {
            // For explicit named port connections, having an empty expression means no connection,
            // so we never take the default value here.
            if (conn.expr)
                return createConnection(port, *conn.expr, attrs);

            return emptyConnection(port);
        }

        return implicitNamedPort(port, attrs, conn.name.range(), false);
    }